

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_intern(sexp ctx,char *str,sexp_sint_t len)

{
  int iVar1;
  ushort **ppuVar2;
  sexp_uint_t sVar3;
  size_t in_RDX;
  sexp in_RSI;
  long in_RDI;
  char *p;
  sexp_sint_t res;
  sexp_sint_t i;
  sexp_sint_t bucket;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp sym;
  sexp tmp;
  sexp ls;
  char c;
  sexp_sint_t newbits;
  sexp_sint_t space;
  sexp_huff_entry he;
  sexp in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar4;
  sexp ctx_00;
  char *str_00;
  sexp psVar5;
  sexp *local_68;
  undefined8 local_60;
  sexp local_58;
  long local_50;
  int *local_48;
  byte local_39;
  ulong local_38;
  long local_30;
  sexp_huff_entry local_24;
  size_t local_20;
  sexp local_18;
  long local_10;
  sexp local_8;
  
  local_58 = (sexp)0x43e;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&local_68,0,0x10);
  psVar5 = (sexp)0x0;
  ctx_00 = local_18;
  if ((long)local_20 < 0) {
    local_20 = strlen((char *)local_18);
  }
  str_00 = (char *)0x0;
  local_30 = 4;
  if (((local_20 == 0) ||
      (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)ctx_00->tag] & 0x800) != 0)) ||
     ((((char)ctx_00->tag == '+' || ((char)ctx_00->tag == '-')) && (1 < (long)local_20)))) {
LAB_001122b7:
    sVar3 = sexp_string_hash((char *)ctx_00,local_20 - (long)psVar5,(sexp_uint_t)str_00);
    local_48 = *(int **)(*(long *)(*(long *)(local_10 + 0x28) + 0x10) + 0x10 + (sVar3 % 0x185) * 8);
    while( true ) {
      uVar4 = false;
      if (((ulong)local_48 & 3) == 0) {
        uVar4 = *local_48 == 6;
      }
      if ((bool)uVar4 == false) {
        local_68 = &local_58;
        local_60 = *(undefined8 *)(local_10 + 0x6080);
        *(sexp ***)(local_10 + 0x6080) = &local_68;
        psVar5 = sexp_c_string(psVar5,str_00,(sexp_sint_t)ctx_00);
        if ((((ulong)psVar5 & 3) == 0) && (psVar5->tag == 0x13)) {
          return psVar5;
        }
        local_58 = (psVar5->value).type.name;
        local_58->tag = 7;
        sexp_push_op(ctx_00,(sexp_conflict *)CONCAT17(uVar4,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff68);
        *(undefined8 *)(local_10 + 0x6080) = local_60;
        return local_58;
      }
      local_50 = *(long *)(local_48 + 2);
      if ((*(size_t *)(local_50 + 8) == local_20) &&
         (iVar1 = strncmp((char *)local_18,(char *)(local_50 + 0x10),local_20), iVar1 == 0)) break;
      local_48 = *(int **)(local_48 + 4);
    }
    local_8 = *(sexp *)(local_48 + 2);
  }
  else {
    for (; (long)psVar5 < (long)local_20; psVar5 = (sexp)((long)&psVar5->tag + 1)) {
      local_39 = (byte)ctx_00->tag;
      if (((((local_39 < 0x21) || (0x7f < local_39)) || (local_39 == 0x5c)) ||
          ((local_39 == 0x7c || (local_39 == 0x2e)))) ||
         ((local_39 == 0x23 || (iVar1 = sexp_is_separator((int)(char)local_39), iVar1 != 0))))
      goto LAB_001122b7;
      local_24 = huff_table[local_39];
      local_38 = (ulong)local_24.len;
      if (0x40 < local_30 + local_38) goto LAB_001122b7;
      str_00 = (char *)((ulong)local_24.bits << ((byte)local_30 & 0x3f) | (ulong)str_00);
      local_30 = local_38 + local_30;
      ctx_00 = (sexp)((long)&ctx_00->tag + 1);
    }
    local_8 = (sexp)(str_00 + 6);
  }
  return local_8;
}

Assistant:

sexp sexp_intern(sexp ctx, const char *str, sexp_sint_t len) {
#if SEXP_USE_HUFF_SYMS
  struct sexp_huff_entry he;
  sexp_sint_t space, newbits;
  char c;
#endif
  sexp ls, tmp;
  sexp_gc_var1(sym);
  sexp_sint_t bucket=0;
#if (SEXP_USE_HASH_SYMS || SEXP_USE_HUFF_SYMS)
  sexp_sint_t i=0, res=FNV_OFFSET_BASIS;
  const char *p=str;
#endif

  if (len < 0) len = strlen(str);

#if SEXP_USE_HUFF_SYMS
  res = 0;
  space = SEXP_IMMEDIATE_BITS;
  if (len == 0 || sexp_isdigit((unsigned char)p[0])
      || ((p[0] == '+' || p[0] == '-') && len > 1))
    goto normal_intern;
  for ( ; i<len; i++, p++) {
    c = *p;
    if ((unsigned char)c <= 32 || (unsigned char)c > 127 || c == '\\' || c == '|' || c == '.' || c =='#' || sexp_is_separator(c))
      goto normal_intern;
    he = huff_table[(unsigned char)c];
    newbits = he.len;
    if ((space+newbits) > (sizeof(sexp)*8))
      goto normal_intern;
    res |= (((sexp_uint_t) he.bits) << space);
    space += newbits;
  }
  return (sexp) (res + SEXP_ISYMBOL_TAG);

 normal_intern:
#endif
#if SEXP_USE_HASH_SYMS
  bucket = (sexp_string_hash(p, len-i, res) % SEXP_SYMBOL_TABLE_SIZE);
#endif
  for (ls=sexp_context_symbols(ctx)[bucket]; sexp_pairp(ls); ls=sexp_cdr(ls))
    if ((sexp_lsymbol_length(tmp=sexp_car(ls)) == len)
        && ! strncmp(str, sexp_lsymbol_data(tmp), len))
      return sexp_car(ls);

  /* not found, make a new symbol */
  sexp_gc_preserve1(ctx, sym);
  sym = sexp_c_string(ctx, str, len);
  if (sexp_exceptionp(sym)) return sym;
#if ! SEXP_USE_PACKED_STRINGS
  sym = sexp_string_bytes(sym);
#endif
  sexp_pointer_tag(sym) = SEXP_SYMBOL;
  sexp_push(ctx, sexp_context_symbols(ctx)[bucket], sym);
  sexp_gc_release1(ctx);
  return sym;
}